

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Resupply_Received_PDU::Encode(Resupply_Received_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pSVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Resupply_Received_PDU *this_local;
  
  Logistics_Header::Encode(&this->super_Logistics_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,this->m_ui8NumSupplyTypes);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding1);
  KDataStream::operator<<(pKVar2,this->m_ui8Padding2);
  citrEnd = std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::
            begin(&this->m_vSupplies);
  local_28._M_current =
       (Supplies *)
       std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::end
                 (&this->m_vSupplies);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
             ::operator->(&citrEnd);
    (*(pSVar3->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[5])(pSVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Resupply_Received_PDU::Encode( KDataStream & stream ) const
{
    Logistics_Header::Encode( stream );
    stream << m_ui8NumSupplyTypes
           << m_ui16Padding1
           << m_ui8Padding2;

    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}